

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O1

void __thiscall
SRCTools::FIRResampler::getOutSamplesStereo(FIRResampler *this,FloatSample **outSamples)

{
  double __x;
  FIRCoefficient *pFVar1;
  FloatSample (*paFVar2) [2];
  FloatSample *pFVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar8 = this->ringBufferPosition;
  __x = this->phase;
  if ((this->constants).usePhaseInterpolation == true) {
    dVar4 = floor(__x);
    uVar6 = (ulong)__x;
    uVar7 = (this->constants).numberOfTaps - (uint)(__x - dVar4 != 0.0);
    fVar9 = 0.0;
    fVar10 = 0.0;
    if ((uint)uVar6 < uVar7) {
      pFVar1 = (this->constants).taps;
      paFVar2 = (this->constants).ringBuffer;
      do {
        fVar11 = pFVar1[uVar6 & 0xffffffff];
        fVar11 = (float)((double)(pFVar1[(int)uVar6 + 1] - fVar11) * (__x - dVar4) + (double)fVar11)
        ;
        fVar10 = fVar10 + paFVar2[uVar8][0] * fVar11;
        fVar9 = fVar9 + fVar11 * paFVar2[uVar8][1];
        uVar8 = uVar8 + 1 & (this->constants).delayLineMask;
        uVar5 = (int)uVar6 + (this->constants).numberOfPhases;
        uVar6 = (ulong)uVar5;
      } while (uVar5 < uVar7);
    }
  }
  else {
    uVar6 = (ulong)__x;
    uVar7 = (this->constants).numberOfTaps;
    fVar9 = 0.0;
    fVar10 = 0.0;
    if ((uint)uVar6 < uVar7) {
      paFVar2 = (this->constants).ringBuffer;
      do {
        fVar11 = (this->constants).taps[uVar6 & 0xffffffff];
        fVar10 = fVar10 + paFVar2[uVar8][0] * fVar11;
        fVar9 = fVar9 + fVar11 * paFVar2[uVar8][1];
        uVar8 = uVar8 + 1 & (this->constants).delayLineMask;
        uVar5 = (int)uVar6 + (this->constants).numberOfPhases;
        uVar6 = (ulong)uVar5;
      } while (uVar5 < uVar7);
    }
  }
  pFVar3 = *outSamples;
  *outSamples = pFVar3 + 1;
  *pFVar3 = fVar10;
  *outSamples = pFVar3 + 2;
  pFVar3[1] = fVar9;
  this->phase = (this->constants).phaseIncrement + this->phase;
  return;
}

Assistant:

void FIRResampler::getOutSamplesStereo(FloatSample *&outSamples) {
	FloatSample leftSample = 0.0;
	FloatSample rightSample = 0.0;
	unsigned int delaySampleIx = ringBufferPosition;
	if (constants.usePhaseInterpolation) {
		double phaseFraction = phase - floor(phase);
		unsigned int maxTapIx = phaseFraction == 0 ? constants.numberOfTaps : constants.numberOfTaps - 1;
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < maxTapIx; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = FIRCoefficient(constants.taps[tapIx] + (constants.taps[tapIx + 1] - constants.taps[tapIx]) * phaseFraction);
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	} else {
		// Optimised for rational resampling ratios when phase is always integer
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < constants.numberOfTaps; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = constants.taps[tapIx];
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	}
	*(outSamples++) = leftSample;
	*(outSamples++) = rightSample;
	phase += constants.phaseIncrement;
}